

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

char * flatbuffers::GenTextFile(Parser *parser,string *path,string *file_name)

{
  bool bVar1;
  SizeT SVar2;
  char *pcVar3;
  char *buf;
  size_t len;
  uint8_t *flatbuffer;
  string local_c8;
  undefined4 local_a4;
  Parser *local_a0;
  char *err;
  string text;
  undefined1 local_48 [8];
  string json;
  string *file_name_local;
  string *path_local;
  Parser *parser_local;
  
  json.field_2._8_8_ = file_name;
  if (((parser->opts).use_flexbuffers & 1U) == 0) {
    SVar2 = FlatBufferBuilderImpl<false>::GetSize(&parser->builder_);
    if ((SVar2 == 0) || (parser->root_struct_def_ == (StructDef *)0x0)) {
      parser_local = (Parser *)0x0;
    }
    else {
      std::__cxx11::string::string((string *)&err);
      flatbuffer = FlatBufferBuilderImpl<false>::GetBufferPointer(&parser->builder_);
      local_a0 = (Parser *)GenText(parser,flatbuffer,(string *)&err);
      parser_local = local_a0;
      if (local_a0 == (Parser *)0x0) {
        TextFileName(&local_c8,path,(string *)json.field_2._8_8_);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        bVar1 = SaveFile(pcVar3,(string *)&err,false);
        parser_local = (Parser *)"SaveFile failed";
        if (bVar1) {
          parser_local = (Parser *)0x0;
        }
        std::__cxx11::string::~string((string *)&local_c8);
      }
      local_a4 = 1;
      std::__cxx11::string::~string((string *)&err);
    }
  }
  else {
    std::__cxx11::string::string((string *)local_48);
    flexbuffers::Reference::ToString
              (&parser->flex_root_,true,(bool)((parser->opts).strict_json & 1),(string *)local_48);
    TextFileName((string *)((long)&text.field_2 + 8),path,(string *)json.field_2._8_8_);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    buf = (char *)std::__cxx11::string::c_str();
    len = std::__cxx11::string::size();
    bVar1 = SaveFile(pcVar3,buf,len,true);
    parser_local = (Parser *)"SaveFile failed";
    if (bVar1) {
      parser_local = (Parser *)0x0;
    }
    std::__cxx11::string::~string((string *)(text.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_48);
  }
  return (char *)parser_local;
}

Assistant:

const char *GenTextFile(const Parser &parser, const std::string &path,
                             const std::string &file_name) {
  if (parser.opts.use_flexbuffers) {
    std::string json;
    parser.flex_root_.ToString(true, parser.opts.strict_json, json);
    return flatbuffers::SaveFile(TextFileName(path, file_name).c_str(),
                                 json.c_str(), json.size(), true)
               ? nullptr
               : "SaveFile failed";
  }
  if (!parser.builder_.GetSize() || !parser.root_struct_def_) return nullptr;
  std::string text;
  auto err = GenText(parser, parser.builder_.GetBufferPointer(), &text);
  if (err) return err;
  return flatbuffers::SaveFile(TextFileName(path, file_name).c_str(), text,
                               false)
             ? nullptr
             : "SaveFile failed";
}